

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions_reductions.hpp
# Opt level: O0

size_type __thiscall
std::experimental::detail::
dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,0ul,3ul>
::operator()(dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,0ul,3ul>
             *this,dimensions<3UL,_18446744073709551615UL,_9UL> d0)

{
  value_type v0;
  unsigned_long uVar1;
  size_type v1;
  dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,3ul>
  local_1b;
  identity_by_value local_1a;
  multiplies_by_value local_19;
  dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,0ul,3ul>
  *local_18;
  dims_unary_reduction<std::experimental::detail::identity_by_value,_std::experimental::detail::multiplies_by_value,_std::experimental::detail::static_sentinel<1UL>,_0UL,_3UL>
  *this_local;
  dimensions<3UL,_18446744073709551615UL,_9UL> d0_local;
  
  local_18 = this;
  this_local = (dims_unary_reduction<std::experimental::detail::identity_by_value,_std::experimental::detail::multiplies_by_value,_std::experimental::detail::static_sentinel<1UL>,_0UL,_3UL>
                *)d0.dynamic_dims_._M_elems[0];
  v0 = dimensions<3UL,_18446744073709551615UL,_9UL>::operator[]<unsigned_long>
                 ((dimensions<3UL,_18446744073709551615UL,_9UL> *)&this_local,0);
  uVar1 = identity_by_value::operator()(&local_1a,v0);
  v1 = dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,3ul>
       ::operator()(&local_1b,(dimensions<3UL,_18446744073709551615UL,_9UL>)this_local);
  uVar1 = multiplies_by_value::operator()(&local_19,uVar1,v1);
  return uVar1;
}

Assistant:

constexpr typename dimensions<Dims0...>::size_type operator()(
        dimensions<Dims0...> d0
        ) const noexcept
    {
        static_assert(
            std::rank<dimensions<Dims0...> >::value == Size 
          , "Size not equal to rank of argument"
        );
        return Reduction()(
            Op()(d0[Idx])
          , dims_unary_reduction<Op, Reduction, Sentinel, Idx + 1, Size>()
                (std::move(d0))
        );
    }